

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

void __thiscall libtorrent::aux::torrent::hashes_rejected(torrent *this,hash_request *req)

{
  hash_picker *this_00;
  pointer pppVar1;
  bt_peer_connection *this_01;
  int iVar2;
  pointer pppVar3;
  
  this_00 = (this->super_torrent_hot_members).m_hash_picker._M_t.
            super___uniq_ptr_impl<libtorrent::aux::hash_picker,_std::default_delete<libtorrent::aux::hash_picker>_>
            ._M_t.
            super__Tuple_impl<0UL,_libtorrent::aux::hash_picker_*,_std::default_delete<libtorrent::aux::hash_picker>_>
            .super__Head_base<0UL,_libtorrent::aux::hash_picker_*,_false>._M_head_impl;
  if (this_00 != (hash_picker *)0x0) {
    hash_picker::hashes_rejected(this_00,req);
    pppVar1 = (this->super_torrent_hot_members).m_connections.
              super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
              .
              super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (pppVar3 = (this->super_torrent_hot_members).m_connections.
                   super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                   .
                   super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; pppVar3 != pppVar1;
        pppVar3 = pppVar3 + 1) {
      this_01 = (bt_peer_connection *)*pppVar3;
      iVar2 = (*(this_01->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[4])
                        (this_01);
      if ((char)iVar2 == '\0') {
        bt_peer_connection::maybe_send_hash_request(this_01);
      }
    }
  }
  return;
}

Assistant:

void torrent::hashes_rejected(hash_request const& req)
	{
		if (!m_hash_picker) return;
		m_hash_picker->hashes_rejected(req);
		// we need to poke all of the v2 peers in case there are no other
		// outstanding hash requests
		for (auto* peer : m_connections)
		{
			if (peer->type() != connection_type::bittorrent) continue;
			auto* const btpeer = static_cast<bt_peer_connection*>(peer);
			btpeer->maybe_send_hash_request();
		}
	}